

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

zip_flags_t get_flags(char *arg)

{
  char *pcVar1;
  uint local_14;
  zip_flags_t flags;
  char *arg_local;
  
  pcVar1 = strchr(arg,0x43);
  local_14 = (uint)(pcVar1 != (char *)0x0);
  pcVar1 = strchr(arg,99);
  if (pcVar1 != (char *)0x0) {
    local_14 = local_14 | 0x200;
  }
  pcVar1 = strchr(arg,100);
  if (pcVar1 != (char *)0x0) {
    local_14 = local_14 | 2;
  }
  pcVar1 = strchr(arg,0x6c);
  if (pcVar1 != (char *)0x0) {
    local_14 = local_14 | 0x100;
  }
  pcVar1 = strchr(arg,0x75);
  if (pcVar1 != (char *)0x0) {
    local_14 = local_14 | 8;
  }
  return local_14;
}

Assistant:

static zip_flags_t
get_flags(const char *arg) {
    zip_flags_t flags = 0;
    if (strchr(arg, 'C') != NULL)
	flags |= ZIP_FL_NOCASE;
    if (strchr(arg, 'c') != NULL)
	flags |= ZIP_FL_CENTRAL;
    if (strchr(arg, 'd') != NULL)
	flags |= ZIP_FL_NODIR;
    if (strchr(arg, 'l') != NULL)
	flags |= ZIP_FL_LOCAL;
    if (strchr(arg, 'u') != NULL)
	flags |= ZIP_FL_UNCHANGED;
    return flags;
}